

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O0

void __thiscall leveldb::Iterator::~Iterator(Iterator *this)

{
  CleanupNode *pCVar1;
  bool bVar2;
  CleanupNode *next_node;
  CleanupNode *node;
  Iterator *this_local;
  
  this->_vptr_Iterator = (_func_int **)&PTR__Iterator_001653c0;
  bVar2 = CleanupNode::IsEmpty(&this->cleanup_head_);
  if (!bVar2) {
    CleanupNode::Run(&this->cleanup_head_);
    pCVar1 = (this->cleanup_head_).next;
    while (next_node = pCVar1, next_node != (CleanupNode *)0x0) {
      CleanupNode::Run(next_node);
      pCVar1 = next_node->next;
      if (next_node != (CleanupNode *)0x0) {
        operator_delete(next_node);
      }
    }
  }
  return;
}

Assistant:

Iterator::~Iterator() {
  if (!cleanup_head_.IsEmpty()) {
    cleanup_head_.Run();
    for (CleanupNode* node = cleanup_head_.next; node != nullptr;) {
      node->Run();
      CleanupNode* next_node = node->next;
      delete node;
      node = next_node;
    }
  }
}